

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineOutputFile.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DeepScanLineOutputFile::writePixels(DeepScanLineOutputFile *this,int numScanLines)

{
  int *piVar1;
  char cVar2;
  int scanLineMin;
  Data *pDVar3;
  pointer ppLVar4;
  LineBuffer *pLVar5;
  Int64 packedDataSize;
  Int64 unpackedDataSize;
  pointer ppLVar6;
  LineBufferTask *pLVar7;
  ArgExc *pAVar8;
  IoExc *this_00;
  int iVar9;
  size_t i;
  long lVar10;
  string *psVar11;
  ulong uVar12;
  string *psVar13;
  int scanLineMin_00;
  ulong uVar14;
  int iVar15;
  int iVar16;
  bool bVar17;
  int local_1e8;
  int local_1e4;
  int local_1d4;
  TaskGroup taskGroup;
  stringstream _iex_replace_s;
  
  __iex_replace_s = this->_data->_streamData;
  std::mutex::lock(&__iex_replace_s->super_Mutex);
  pDVar3 = this->_data;
  if ((pDVar3->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pDVar3->slices).
      super__Vector_base<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*,_std::allocator<Imf_2_5::(anonymous_namespace)::OutSliceInfo_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar8,"No frame buffer specified as pixel data source.");
    __cxa_throw(pAVar8,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  uVar14 = (long)(pDVar3->currentScanLine - pDVar3->minY) / (long)pDVar3->linesInBuffer;
  uVar12 = uVar14 & 0xffffffff;
  IlmThread_2_5::TaskGroup::TaskGroup(&taskGroup);
  pDVar3 = this->_data;
  scanLineMin = pDVar3->currentScanLine;
  iVar16 = (int)uVar14;
  if (pDVar3->lineOrder == INCREASING_Y) {
    local_1d4 = numScanLines + scanLineMin + -1;
    local_1e8 = (local_1d4 - pDVar3->minY) / pDVar3->linesInBuffer;
    local_1e4 = (local_1e8 - iVar16) + 1;
    iVar9 = (int)((ulong)((long)(pDVar3->lineBuffers).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(pDVar3->lineBuffers).
                               super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar9 <= local_1e4) {
      local_1e4 = iVar9;
    }
    iVar9 = 1;
    if (local_1e4 < 2) {
      local_1e4 = 1;
    }
    iVar15 = local_1e4;
    while (bVar17 = iVar15 != 0, iVar15 = iVar15 + -1, bVar17) {
      pLVar7 = (LineBufferTask *)operator_new(0x20);
      anon_unknown_7::LineBufferTask::LineBufferTask
                (pLVar7,&taskGroup,this->_data,(int)uVar12,scanLineMin,local_1d4);
      IlmThread_2_5::ThreadPool::addGlobalTask((Task *)pLVar7);
      uVar12 = (ulong)((int)uVar12 + 1);
    }
    local_1e8 = local_1e8 + 1;
  }
  else {
    local_1e8 = ((scanLineMin - (pDVar3->minY + numScanLines)) + 1) / pDVar3->linesInBuffer;
    scanLineMin_00 = (scanLineMin - numScanLines) + 1;
    iVar9 = (iVar16 - local_1e8) + 1;
    iVar15 = (int)((ulong)((long)(pDVar3->lineBuffers).
                                 super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(pDVar3->lineBuffers).
                                super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 3);
    if (iVar15 <= iVar9) {
      iVar9 = iVar15;
    }
    iVar15 = 1;
    local_1e4 = 1;
    if (1 < iVar9) {
      iVar15 = iVar9;
      local_1e4 = iVar9;
    }
    while (iVar15 != 0) {
      pLVar7 = (LineBufferTask *)operator_new(0x20);
      anon_unknown_7::LineBufferTask::LineBufferTask
                (pLVar7,&taskGroup,this->_data,(int)uVar12,scanLineMin_00,scanLineMin);
      IlmThread_2_5::ThreadPool::addGlobalTask((Task *)pLVar7);
      uVar12 = (ulong)((int)uVar12 - 1);
      iVar15 = iVar15 + -1;
    }
    local_1e4 = -local_1e4;
    local_1e8 = local_1e8 + -1;
    iVar9 = -1;
    local_1d4 = scanLineMin;
    scanLineMin = scanLineMin_00;
  }
  local_1e4 = iVar16 + local_1e4;
  uVar14 = (ulong)iVar16;
  while( true ) {
    iVar16 = iVar16 + iVar9;
    pDVar3 = this->_data;
    if (pDVar3->missingScanLines < 1) {
      pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::ArgExc::ArgExc
                (pAVar8,"Tried to write more scan lines than specified by the data window.");
      __cxa_throw(pAVar8,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
    }
    ppLVar4 = (pDVar3->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pLVar5 = ppLVar4[uVar14 % (ulong)((long)(pDVar3->lineBuffers).
                                            super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)ppLVar4 >> 3)];
    IlmThread_2_5::Semaphore::wait();
    iVar15 = (*(int *)&pLVar5->field_0x6c - *(int *)&pLVar5->_sem) + 1;
    pDVar3 = this->_data;
    pDVar3->missingScanLines = pDVar3->missingScanLines - iVar15;
    cVar2 = pLVar5->field_0x78;
    if (cVar2 == '\x01') break;
    packedDataSize._0_4_ = pLVar5->scanLineMin;
    packedDataSize._4_4_ = pLVar5->scanLineMax;
    unpackedDataSize._0_4_ = pLVar5->minY;
    unpackedDataSize._4_4_ = pLVar5->maxY;
    anon_unknown_7::writePixelData
              (pDVar3->_streamData,pDVar3,*(int *)((long)&(pLVar5->exception).field_2 + 8),
               pLVar5->endOfLineBufferData,packedDataSize,unpackedDataSize,
               (pLVar5->exception)._M_dataplus._M_p,(pLVar5->exception)._M_string_length);
    piVar1 = &this->_data->currentScanLine;
    *piVar1 = *piVar1 + iVar15 * iVar9;
    IlmThread_2_5::Semaphore::post();
    if (local_1e8 == iVar16) goto LAB_00156b4d;
    iVar15 = local_1e8;
    if (local_1e4 != local_1e8) {
      pLVar7 = (LineBufferTask *)operator_new(0x20);
      anon_unknown_7::LineBufferTask::LineBufferTask
                (pLVar7,&taskGroup,this->_data,local_1e4,scanLineMin,local_1d4);
      IlmThread_2_5::ThreadPool::addGlobalTask((Task *)pLVar7);
      iVar15 = local_1e4 + iVar9;
    }
    uVar14 = uVar14 + (long)iVar9;
    local_1e4 = iVar15;
  }
  pDVar3->currentScanLine = pDVar3->currentScanLine + iVar15 * iVar9;
  IlmThread_2_5::Semaphore::post();
LAB_00156b4d:
  IlmThread_2_5::TaskGroup::~TaskGroup(&taskGroup);
  if (cVar2 == '\0') {
    ppLVar4 = (this->_data->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppLVar6 = (this->_data->lineBuffers).
              super__Vector_base<Imf_2_5::(anonymous_namespace)::LineBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::LineBuffer_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    psVar11 = (string *)0x0;
    for (lVar10 = 0; (long)ppLVar6 - (long)ppLVar4 >> 3 != lVar10; lVar10 = lVar10 + 1) {
      pLVar5 = ppLVar4[lVar10];
      psVar13 = (string *)&pLVar5->field_0x80;
      if (psVar11 != (string *)0x0) {
        psVar13 = psVar11;
      }
      if (pLVar5->field_0x79 != '\0') {
        psVar11 = psVar13;
      }
      pLVar5->field_0x79 = 0;
    }
    if (psVar11 != (string *)0x0) {
      this_00 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::IoExc::IoExc(this_00,psVar11);
      __cxa_throw(this_00,&Iex_2_5::IoExc::typeinfo,Iex_2_5::IoExc::~IoExc);
    }
  }
  IlmThread_2_5::Lock::~Lock((Lock *)&_iex_replace_s);
  return;
}

Assistant:

void
DeepScanLineOutputFile::writePixels (int numScanLines)
{
    try
    {
        Lock lock (*_data->_streamData);

        if (_data->slices.size() == 0)
            throw IEX_NAMESPACE::ArgExc ("No frame buffer specified "
                               "as pixel data source.");

        //
        // Maintain two iterators:
        //     nextWriteBuffer: next linebuffer to be written to the file
        //     nextCompressBuffer: next linebuffer to compress
        //

        int first = (_data->currentScanLine - _data->minY) /
                         _data->linesInBuffer;

        int nextWriteBuffer = first;
        int nextCompressBuffer;
        int stop;
        int step;
        int scanLineMin;
        int scanLineMax;

        {
            //
            // Create a task group for all line buffer tasks. When the
            // taskgroup goes out of scope, the destructor waits until
            // all tasks are complete.
            //

            TaskGroup taskGroup;

            //
            // Determine the range of lineBuffers that intersect the scan
            // line range.  Then add the initial compression tasks to the
            // thread pool.  We always add in at least one task but the
            // individual task might not do anything if numScanLines == 0.
            //

            if (_data->lineOrder == INCREASING_Y)
            {
                int last = (_data->currentScanLine + (numScanLines - 1) -
                            _data->minY) / _data->linesInBuffer;

                scanLineMin = _data->currentScanLine;
                scanLineMax = _data->currentScanLine + numScanLines - 1;

                int numTasks = max (min ((int)_data->lineBuffers.size(),
                                         last - first + 1),
                                    1);

                for (int i = 0; i < numTasks; i++)
                {
                    ThreadPool::addGlobalTask
                        (new LineBufferTask (&taskGroup, _data, first + i,
                                             scanLineMin, scanLineMax));
                }

                nextCompressBuffer = first + numTasks;
                stop = last + 1;
                step = 1;
            }
            else
            {
                int last = (_data->currentScanLine - (numScanLines - 1) -
                            _data->minY) / _data->linesInBuffer;

                scanLineMax = _data->currentScanLine;
                scanLineMin = _data->currentScanLine - numScanLines + 1;

                int numTasks = max (min ((int)_data->lineBuffers.size(),
                                         first - last + 1),
                                    1);

                for (int i = 0; i < numTasks; i++)
                {
                    ThreadPool::addGlobalTask
                        (new LineBufferTask (&taskGroup, _data, first - i,
                                             scanLineMin, scanLineMax));
                }

                nextCompressBuffer = first - numTasks;
                stop = last - 1;
                step = -1;
            }

            while (true)
            {
                if (_data->missingScanLines <= 0)
                {
                    throw IEX_NAMESPACE::ArgExc ("Tried to write more scan lines "
                                       "than specified by the data window.");
                }

                //
                // Wait until the next line buffer is ready to be written
                //

                LineBuffer *writeBuffer =
                    _data->getLineBuffer (nextWriteBuffer);

                writeBuffer->wait();

                int numLines = writeBuffer->scanLineMax -
                               writeBuffer->scanLineMin + 1;

                _data->missingScanLines -= numLines;

                //
                // If the line buffer is only partially full, then it is
                // not complete and we cannot write it to disk yet.
                //

                if (writeBuffer->partiallyFull)
                {
                    _data->currentScanLine = _data->currentScanLine +
                                             step * numLines;
                    writeBuffer->post();

                    return;
                }

                //
                // Write the line buffer
                //

                writePixelData (_data->_streamData, _data, writeBuffer);
                nextWriteBuffer += step;

                _data->currentScanLine = _data->currentScanLine +
                                         step * numLines;

                #ifdef DEBUG

                    assert (_data->currentScanLine ==
                            ((_data->lineOrder == INCREASING_Y) ?
                             writeBuffer->scanLineMax + 1:
                             writeBuffer->scanLineMin - 1));

                #endif

                //
                // Release the lock on the line buffer
                //

                writeBuffer->post();

                //
                // If this was the last line buffer in the scanline range
                //

                if (nextWriteBuffer == stop)
                    break;

                //
                // If there are no more line buffers to compress,
                // then only continue to write out remaining lineBuffers
                //

                if (nextCompressBuffer == stop)
                    continue;

                //
                // Add nextCompressBuffer as a compression task
                //

                ThreadPool::addGlobalTask
                    (new LineBufferTask (&taskGroup, _data, nextCompressBuffer,
                                         scanLineMin, scanLineMax));

                //
                // Update the next line buffer we need to compress
                //

                nextCompressBuffer += step;
            }

            //
            // Finish all tasks
            //
        }

        //
        // Exeption handling:
        //
        // LineBufferTask::execute() may have encountered exceptions, but
        // those exceptions occurred in another thread, not in the thread
        // that is executing this call to OutputFile::writePixels().
        // LineBufferTask::execute() has caught all exceptions and stored
        // the exceptions' what() strings in the line buffers.
        // Now we check if any line buffer contains a stored exception; if
        // this is the case then we re-throw the exception in this thread.
        // (It is possible that multiple line buffers contain stored
        // exceptions.  We re-throw the first exception we find and
        // ignore all others.)
        //

        const string *exception = 0;

        for (size_t i = 0; i < _data->lineBuffers.size(); ++i)
        {
            LineBuffer *lineBuffer = _data->lineBuffers[i];

            if (lineBuffer->hasException && !exception)
                exception = &lineBuffer->exception;

            lineBuffer->hasException = false;
        }

        if (exception)
            throw IEX_NAMESPACE::IoExc (*exception);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Failed to write pixel data to image "
                     "file \"" << fileName() << "\". " << e.what());
        throw;
    }
}